

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool TestTrimPBox(ON_BrepTrim *trim,ON_TextLog *text_log)

{
  bool bVar1;
  double dVar2;
  ON_Interval local_c8;
  ON_3dPoint local_b8;
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  undefined1 local_70 [8];
  ON_BoundingBox pbox;
  double d;
  ON_3dPoint pt;
  ON_TextLog *text_log_local;
  ON_BrepTrim *trim_local;
  
  pt.z = (double)text_log;
  memcpy(local_70,&trim->m_pbox,0x30);
  pbox.m_max.z = (ABS((double)local_70) + ABS(pbox.m_min.z)) * 1.490116119385e-08;
  if (pbox.m_max.z < 2.3283064365386963e-10) {
    pbox.m_max.z = 2.3283064365386963e-10;
  }
  local_70 = (undefined1  [8])((double)local_70 - pbox.m_max.z);
  pbox.m_min.z = pbox.m_max.z + pbox.m_min.z;
  pbox.m_max.z = (ABS(pbox.m_min.x) + ABS(pbox.m_max.x)) * 1.490116119385e-08;
  if (pbox.m_max.z < 2.3283064365386963e-10) {
    pbox.m_max.z = 2.3283064365386963e-10;
  }
  pbox.m_min.x = pbox.m_min.x - pbox.m_max.z;
  pbox.m_max.x = pbox.m_max.z + pbox.m_max.x;
  dVar2 = pbox.m_max.z;
  ON_Curve::PointAtStart(&local_88,(ON_Curve *)trim);
  d = local_88.x;
  pt.x = local_88.y;
  pt.y = local_88.z;
  bVar1 = ON_BoundingBox::IsPointIn((ON_BoundingBox *)local_70,(ON_3dPoint *)&d,0);
  if (bVar1) {
    ON_Curve::PointAtEnd(&local_a0,(ON_Curve *)trim);
    d = local_a0.x;
    pt.x = local_a0.y;
    pt.y = local_a0.z;
    bVar1 = ON_BoundingBox::IsPointIn((ON_BoundingBox *)local_70,(ON_3dPoint *)&d,0);
    if (bVar1) {
      (*(trim->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])();
      local_c8.m_t[1] = dVar2;
      dVar2 = ON_Interval::ParameterAt(&local_c8,0.5);
      ON_Curve::PointAt(&local_b8,(ON_Curve *)trim,dVar2);
      d = local_b8.x;
      pt.x = local_b8.y;
      pt.y = local_b8.z;
      bVar1 = ON_BoundingBox::IsPointIn((ON_BoundingBox *)local_70,(ON_3dPoint *)&d,0);
      if (bVar1) {
        trim_local._7_1_ = true;
      }
      else {
        if (pt.z != 0.0) {
          ON_TextLog::Print((ON_TextLog *)pt.z,
                            "ON_Brep.m_T[%d].m_pbox does not contain middle of trim.\n",
                            (ulong)(uint)trim->m_trim_index);
        }
        trim_local._7_1_ = false;
      }
    }
    else {
      if (pt.z != 0.0) {
        ON_TextLog::Print((ON_TextLog *)pt.z,
                          "ON_Brep.m_T[%d].m_pbox does not contain end of trim.\n",
                          (ulong)(uint)trim->m_trim_index);
      }
      trim_local._7_1_ = false;
    }
  }
  else {
    if (pt.z != 0.0) {
      ON_TextLog::Print((ON_TextLog *)pt.z,
                        "ON_Brep.m_T[%d].m_pbox does not contain start of trim.\n",
                        (ulong)(uint)trim->m_trim_index);
    }
    trim_local._7_1_ = false;
  }
  return trim_local._7_1_;
}

Assistant:

static
bool TestTrimPBox( const ON_BrepTrim& trim, ON_TextLog* text_log )
{
  ON_3dPoint pt;
  double d;
  ON_BoundingBox pbox = trim.m_pbox;

  
  d = ON_SQRT_EPSILON*(fabs(pbox.m_min.x)+fabs(pbox.m_max.x));
  if ( d < ON_ZERO_TOLERANCE )
    d = ON_ZERO_TOLERANCE;
  pbox.m_min.x -= d;
  pbox.m_max.x += d;

  d = ON_SQRT_EPSILON*(fabs(pbox.m_min.y)+fabs(pbox.m_max.y));
  if ( d < ON_ZERO_TOLERANCE )
    d = ON_ZERO_TOLERANCE;
  pbox.m_min.y -= d;
  pbox.m_max.y += d;

  pt = trim.PointAtStart();
  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain start of trim.\n",trim.m_trim_index);
    return false;
  }

  pt = trim.PointAtEnd();

  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain end of trim.\n",trim.m_trim_index);
    return false;
  }

  pt = trim.PointAt(trim.Domain().ParameterAt(0.5));
  if ( !pbox.IsPointIn(pt) )
  {
    if ( text_log )
       text_log->Print("ON_Brep.m_T[%d].m_pbox does not contain middle of trim.\n",trim.m_trim_index);
    return false;
  }

  return true;
}